

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sed_lb_ed_test.cc
# Opt level: O2

int main(void)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  ostream *poVar4;
  string *psVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  CostModel ucm;
  string input_tree_2_string;
  string input_tree_1_string;
  string line;
  SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED> sed_algorithm;
  TreeIndexSED ti1;
  Node<label::StringLabel> t2;
  Node<label::StringLabel> t1;
  LabelDictionary ld;
  TreeIndexSED ti2;
  BracketNotationParser<label::StringLabel> bnp;
  ifstream test_cases_file;
  
  ld.label_to_id_dictionary_._M_h._M_buckets = &ld.label_to_id_dictionary_._M_h._M_single_bucket;
  ld.label_to_id_dictionary_._M_h._M_bucket_count = 1;
  ld.label_to_id_dictionary_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ld.label_to_id_dictionary_._M_h._M_element_count = 0;
  ld.label_to_id_dictionary_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ld.label_to_id_dictionary_._M_h._M_rehash_policy._M_next_resize = 0;
  ld.label_to_id_dictionary_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ld.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ld.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  ld.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  ld.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  ld._76_8_ = 0;
  ucm.ld_ = &ld;
  std::ifstream::ifstream(&test_cases_file,"sed_lb_ed_test_data.txt",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error while opening file.");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar6 = -1;
  }
  else {
    sed_algorithm.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.
    _vptr_TEDAlgorithm = (_func_int **)&PTR_ted_00108d80;
    ti1.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ti1.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ti1.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ti1.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ti1.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ti1.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ti2.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ti2.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ti2.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ti2.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ti2.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ti2.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    iVar6 = 0;
    sed_algorithm.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.c_ =
         &ucm;
    do {
      do {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&test_cases_file,(string *)&line);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          iVar6 = 0;
          goto LAB_00102861;
        }
      } while (*line._M_dataplus._M_p != '#');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&test_cases_file,(string *)&line);
      std::__cxx11::string::string((string *)&input_tree_1_string,(string *)&line);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&test_cases_file,(string *)&line);
      std::__cxx11::string::string((string *)&input_tree_2_string,(string *)&line);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&test_cases_file,(string *)&line);
      dVar7 = std::__cxx11::stod(&line,(size_t *)0x0);
      parser::BracketNotationParser<label::StringLabel>::BracketNotationParser(&bnp);
      bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input
                        (&bnp,&input_tree_1_string);
      if (bVar2) {
        bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input
                          (&bnp,&input_tree_2_string);
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Incorrect format of destination tree: \'")
          ;
          psVar5 = &input_tree_2_string;
          goto LAB_001027e3;
        }
        parser::BracketNotationParser<label::StringLabel>::parse_single
                  (&t1,&bnp,&input_tree_1_string);
        parser::BracketNotationParser<label::StringLabel>::parse_single
                  (&t2,&bnp,&input_tree_2_string);
        node::
        index_tree<node::TreeIndexSED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                  (&ti1,&t1,&ld,&ucm);
        node::
        index_tree<node::TreeIndexSED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                  (&ti2,&t2,&ld,&ucm);
        dVar8 = ted_lb::
                SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>::
                ted(&sed_algorithm,&ti1,&ti2);
        if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
          std::operator<<((ostream *)&std::cerr,"Incorrect SED result: ");
          poVar4 = std::ostream::_M_insert<double>(dVar8);
          std::operator<<(poVar4," instead of ");
          poVar4 = std::ostream::_M_insert<double>(dVar7);
          std::endl<char,std::char_traits<char>>(poVar4);
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&input_tree_1_string);
          std::endl<char,std::char_traits<char>>(poVar4);
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&input_tree_2_string);
          std::endl<char,std::char_traits<char>>(poVar4);
          iVar6 = -1;
        }
        bVar2 = dVar7 == dVar8;
        node::Node<label::StringLabel>::~Node(&t2);
        node::Node<label::StringLabel>::~Node(&t1);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Incorrect format of source tree: \'");
        psVar5 = &input_tree_1_string;
LAB_001027e3:
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\'. Is the number of opening and closing brackets equal?");
        std::endl<char,std::char_traits<char>>(poVar4);
        bVar2 = false;
        iVar6 = -1;
      }
      parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser(&bnp);
      std::__cxx11::string::~string((string *)&input_tree_2_string);
      std::__cxx11::string::~string((string *)&input_tree_1_string);
    } while (bVar2);
LAB_00102861:
    std::__cxx11::string::~string((string *)&line);
    node::TreeIndexSED::~TreeIndexSED(&ti2);
    node::TreeIndexSED::~TreeIndexSED(&ti1);
  }
  std::ifstream::~ifstream(&test_cases_file);
  label::LabelDictionary<label::StringLabel>::~LabelDictionary(&ld);
  return iVar6;
}

Assistant:

int main() {

  // Type aliases.
  using Label = label::StringLabel;
  using CostModel = cost_model::UnitCostModelLD<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  
  // Initialise label dictionary - separate dictionary for each test tree
  // becuse it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialise cost model.
  CostModel ucm(ld);

  // Parse test cases from file.
  std::ifstream test_cases_file("sed_lb_ed_test_data.txt");
  if (!test_cases_file.is_open()) {
    std::cerr << "Error while opening file." << std::endl;
    return -1;
  }

  // Initialise String Edit Distance algorithm.
  ted_lb::SEDTreeIndex<CostModel, node::TreeIndexSED> sed_algorithm(ucm);
  
  // Initialise two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  node::TreeIndexSED ti1;
  node::TreeIndexSED ti2;

  // Read test cases from a file line by line.
  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      // Read the single test case.
      std::getline(test_cases_file, line);
      std::string input_tree_1_string = line;
      std::getline(test_cases_file, line);
      std::string input_tree_2_string = line;
      std::getline(test_cases_file, line);
      double correct_result = std::stod(line);

      parser::BracketNotationParser<Label> bnp;

      // Validate test trees.
      if (!bnp.validate_input(input_tree_1_string)) {
        std::cerr << "Incorrect format of source tree: '" << input_tree_1_string << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      if (!bnp.validate_input(input_tree_2_string)) {
        std::cerr << "Incorrect format of destination tree: '" << input_tree_2_string << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      node::Node<Label> t1 = bnp.parse_single(input_tree_1_string);
      node::Node<Label> t2 = bnp.parse_single(input_tree_2_string);

      // Index input trees.
      node::index_tree(ti1, t1, ld, ucm);
      node::index_tree(ti2, t2, ld, ucm);

      // Execute the algorithm.
      double computed_results = sed_algorithm.ted(ti1, ti2);

      if (correct_result != computed_results) {
        std::cerr << "Incorrect SED result: " << computed_results << " instead of " << correct_result << std::endl;
        std::cerr << input_tree_1_string << std::endl;
        std::cerr << input_tree_2_string << std::endl;
        return -1;
      }
    }
  }

  return 0;
}